

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O2

void avro::codec_traits<testgen_r::_bigrecord_r_Union__0__>::decode
               (Decoder *d,_bigrecord_r_Union__0__ *v)

{
  ulong uVar1;
  Exception *this;
  allocator<char> local_39;
  int32_t vv;
  undefined4 uStack_34;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  uVar1 = (**(code **)(*(long *)d + 0xb0))();
  if (uVar1 < 2) {
    if ((uVar1 & 1) == 0) {
      _vv = (pointer)&local_28;
      local_30 = 0;
      local_28._M_local_buf[0] = '\0';
      codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::decode(d,(string *)&vv);
      testgen_r::_bigrecord_r_Union__0__::set_string(v,(string *)&vv);
      std::__cxx11::string::~string((string *)&vv);
    }
    else {
      vv = (**(code **)(*(long *)d + 0x28))(d);
      testgen_r::_bigrecord_r_Union__0__::set_int(v,&vv);
    }
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&vv,"Union index too big",&local_39);
  Exception::Exception(this,(string *)&vv);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void decode(Decoder& d, testgen_r::_bigrecord_r_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::string vv;
                avro::decode(d, vv);
                v.set_string(vv);
            }
            break;
        case 1:
            {
                int32_t vv;
                avro::decode(d, vv);
                v.set_int(vv);
            }
            break;
        }
    }